

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_ctx_getopt(nni_ctx *ctx,char *opt,void *v,size_t *szp,nni_type t)

{
  nni_sock *pnVar1;
  int iVar2;
  int local_44;
  nni_option *pnStack_40;
  int rv;
  nni_option *o;
  nni_sock *sock;
  nni_type t_local;
  size_t *szp_local;
  void *v_local;
  char *opt_local;
  nni_ctx *ctx_local;
  
  pnVar1 = ctx->c_sock;
  local_44 = 9;
  nni_mtx_lock(&pnVar1->s_mx);
  iVar2 = strcmp(opt,"recv-timeout");
  if (iVar2 == 0) {
    local_44 = nni_copyout_ms(ctx->c_rcvtimeo,v,szp,t);
  }
  else {
    iVar2 = strcmp(opt,"send-timeout");
    if (iVar2 == 0) {
      local_44 = nni_copyout_ms(ctx->c_sndtimeo,v,szp,t);
    }
    else if ((ctx->c_ops).ctx_options != (nni_option *)0x0) {
      for (pnStack_40 = (ctx->c_ops).ctx_options; pnStack_40->o_name != (char *)0x0;
          pnStack_40 = pnStack_40 + 1) {
        iVar2 = strcmp(opt,pnStack_40->o_name);
        if (iVar2 == 0) {
          if (pnStack_40->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
            local_44 = 0x19;
          }
          else {
            local_44 = (*pnStack_40->o_get)(ctx->c_data,v,szp,t);
          }
          break;
        }
      }
    }
  }
  nni_mtx_unlock(&pnVar1->s_mx);
  return local_44;
}

Assistant:

int
nni_ctx_getopt(nni_ctx *ctx, const char *opt, void *v, size_t *szp, nni_type t)
{
	nni_sock   *sock = ctx->c_sock;
	nni_option *o;
	int         rv = NNG_ENOTSUP;

	nni_mtx_lock(&sock->s_mx);
	if (strcmp(opt, NNG_OPT_RECVTIMEO) == 0) {
		rv = nni_copyout_ms(ctx->c_rcvtimeo, v, szp, t);
	} else if (strcmp(opt, NNG_OPT_SENDTIMEO) == 0) {
		rv = nni_copyout_ms(ctx->c_sndtimeo, v, szp, t);
	} else if (ctx->c_ops.ctx_options != NULL) {
		for (o = ctx->c_ops.ctx_options; o->o_name != NULL; o++) {
			if (strcmp(opt, o->o_name) != 0) {
				continue;
			}
			if (o->o_get == NULL) {
				rv = NNG_EWRITEONLY;
				break;
			}
			rv = o->o_get(ctx->c_data, v, szp, t);
			break;
		}
	}
	nni_mtx_unlock(&sock->s_mx);
	return (rv);
}